

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-type.hpp
# Opt level: O1

void __thiscall
yactfr::OptionalWithIntegerSelectorType<unsigned_long_long>::OptionalWithIntegerSelectorType
          (OptionalWithIntegerSelectorType<unsigned_long_long> *this,_tKind kind,uint minAlign,
          Up *dt,DataLocation *selLoc,SelectorRangeSet *selRanges,Up *attrs)

{
  _Head_base<0UL,_const_yactfr::DataType_*,_false> local_20;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_18;
  
  local_20._M_head_impl =
       (dt->_M_t).
       super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>
       .super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl;
  (dt->_M_t).
  super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::DataType_*,_std::default_delete<const_yactfr::DataType>_>.
  super__Head_base<0UL,_const_yactfr::DataType_*,_false>._M_head_impl = (DataType *)0x0;
  local_18._M_head_impl =
       (attrs->_M_t).
       super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
       super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
  (attrs->_M_t).
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl = (MapItem *)0x0;
  OptionalType::OptionalType
            (&this->super_OptionalType,kind,minAlign,(Up *)&local_20,selLoc,(Up *)&local_18);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_18);
  if (local_20._M_head_impl != (DataType *)0x0) {
    (*(local_20._M_head_impl)->_vptr_DataType[1])();
  }
  local_20._M_head_impl = (DataType *)0x0;
  (this->super_OptionalType).super_CompoundDataType.super_DataType._vptr_DataType =
       (_func_int **)&PTR__OptionalWithIntegerSelectorType_0030b030;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->_selRanges)._ranges._M_t._M_impl.super__Rb_tree_header,
             &(selRanges->_ranges)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

explicit OptionalWithIntegerSelectorType(_tKind kind, unsigned int minAlign, DataType::Up dt,
                                             DataLocation&& selLoc, SelectorRangeSet&& selRanges,
                                             MapItem::Up attrs) :
        OptionalType {kind, minAlign, std::move(dt), std::move(selLoc), std::move(attrs)},
        _selRanges {std::move(selRanges)}
    {
    }